

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_dtls_replay_check(mbedtls_ssl_context *ssl)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  uVar2 = ssl_load_six_bytes(ssl->in_ctr + 2);
  iVar1 = 0;
  if (((ssl->conf->field_0x165 & 0x10) != 0) &&
     (uVar3 = ssl->in_window_top - uVar2, uVar2 <= ssl->in_window_top)) {
    if (uVar3 < 0x40) {
      iVar1 = -(uint)((ssl->in_window >> (uVar3 & 0x3f) & 1) != 0);
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_dtls_replay_check( mbedtls_ssl_context *ssl )
{
    uint64_t rec_seqnum = ssl_load_six_bytes( ssl->in_ctr + 2 );
    uint64_t bit;

    if( ssl->conf->anti_replay == MBEDTLS_SSL_ANTI_REPLAY_DISABLED )
        return( 0 );

    if( rec_seqnum > ssl->in_window_top )
        return( 0 );

    bit = ssl->in_window_top - rec_seqnum;

    if( bit >= 64 )
        return( -1 );

    if( ( ssl->in_window & ( (uint64_t) 1 << bit ) ) != 0 )
        return( -1 );

    return( 0 );
}